

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O0

void __thiscall afsm::test::TranFSM_AllEvents_Test::TestBody(TranFSM_AllEvents_Test *this)

{
  bool bVar1;
  type *ptVar2;
  ostream *poVar3;
  type *ptVar4;
  type *ptVar5;
  char *pcVar6;
  char *in_R9;
  AssertHelper local_888;
  Message local_880;
  terminate local_871;
  event_process_result local_870 [2];
  undefined1 local_868 [8];
  AssertionResult gtest_ar_14;
  Message local_850;
  ready_for_query local_841;
  event_process_result local_840 [2];
  undefined1 local_838 [8];
  AssertionResult gtest_ar_13;
  Message local_820;
  ready_for_query local_811;
  event_process_result local_810 [2];
  undefined1 local_808 [8];
  AssertionResult gtest_ar_12;
  Message local_7f0;
  ready_for_query local_7e1;
  event_process_result local_7e0 [2];
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_11;
  Message local_7c0;
  no_data local_7b1;
  event_process_result local_7b0 [2];
  undefined1 local_7a8 [8];
  AssertionResult gtest_ar_10;
  Message local_790;
  exec_prepared local_781;
  event_process_result local_780 [2];
  undefined1 local_778 [8];
  AssertionResult gtest_ar_9;
  Message local_760;
  ready_for_query local_751;
  event_process_result local_750 [2];
  undefined1 local_748 [8];
  AssertionResult gtest_ar_8;
  Message local_730;
  command_complete local_721;
  event_process_result local_720 [2];
  undefined1 local_718 [8];
  AssertionResult gtest_ar_7;
  Message local_700;
  row_event local_6f1;
  event_process_result local_6f0 [2];
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar_6;
  Message local_6d0;
  row_event local_6c1;
  event_process_result local_6c0 [2];
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_688;
  Message local_680;
  bool local_671;
  undefined1 local_670 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_640;
  Message local_638;
  bool local_629;
  undefined1 local_628 [8];
  AssertionResult gtest_ar__7;
  Message local_610;
  row_description local_601;
  event_process_result local_600 [2];
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_5c8;
  Message local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_580;
  Message local_578;
  bool local_569;
  undefined1 local_568 [8];
  AssertionResult gtest_ar__5;
  Message local_550;
  execute local_541;
  event_process_result local_540 [2];
  undefined1 local_538 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_508;
  Message local_500;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar__4;
  Message local_4d8;
  ready_for_query local_4c9;
  event_process_result local_4c8 [2];
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_448;
  Message local_440;
  bool local_431;
  undefined1 local_430 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_400;
  Message local_3f8;
  bool local_3e9;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__1;
  Message local_3d0;
  complete local_3c1;
  event_process_result local_3c0 [2];
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_388;
  Message local_380;
  bool local_371;
  undefined1 local_370 [8];
  AssertionResult gtest_ar_;
  Message local_358;
  connect local_349;
  event_process_result local_348 [2];
  undefined1 local_340 [8];
  AssertionResult gtest_ar;
  string local_310 [32];
  string local_2f0 [48];
  undefined1 local_2c0 [8];
  connection_fsm fsm;
  TranFSM_AllEvents_Test *this_local;
  
  fsm.deferred_event_ids_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::state_machine((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                   *)local_2c0);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::make_observer<char_const(&)[19]>
            ((observer_wrapper<afsm::test::test_fsm_observer> *)
             ((long)&fsm.
                     super_state_machine_base<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                     .super_type.
                     super_state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                     .
                     super_transition_container<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>_>
                     .
                     super_transition_container<afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>,_afsm::test::connection_fsm_def,_std::atomic<unsigned_long>,_false>
                     .transitions_ + 0x158),(char (*) [19])"connection_fsm_def");
  ptVar2 = detail::
           state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           ::get_state<afsm::test::connection_fsm_def>
                     ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                       *)local_2c0);
  (**(code **)((long)(ptVar2->
                     super_state_machine_base<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                     ).super_type.
                     super_state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                     .super_state_base<afsm::test::connection_fsm_def>.super_type.
                     super_connection_fsm_def.
                     super_state_machine<connection_fsm_def,_def::tags::common_base<state_name>_> +
              0x10))(local_2f0);
  poVar3 = std::operator<<((ostream *)&std::cerr,local_2f0);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_2f0);
  ptVar4 = detail::
           state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           ::get_state<afsm::test::connection_fsm_def::transaction>
                     ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                       *)local_2c0);
  (**(code **)((long)(ptVar4->
                     super_state_machine_base<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                     ).super_type.
                     super_state_machine_base_impl<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                     .super_state_base<afsm::test::connection_fsm_def::transaction>.super_type.
                     super_transaction.super_state_machine<transaction> + 0x10))(local_310);
  poVar3 = std::operator<<((ostream *)&std::cerr,local_310);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_310);
  ptVar5 = detail::
           state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
           ::get_state<afsm::test::connection_fsm_def::transaction::simple_query>
                     ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                       *)local_2c0);
  (**(code **)((long)(ptVar5->
                     super_state_machine_base<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                     ).super_type.
                     super_state_machine_base_impl<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                     .super_state_base<afsm::test::connection_fsm_def::transaction::simple_query>.
                     super_type.super_simple_query.super_state_machine<simple_query> + 0x10))
            (&gtest_ar.message_);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&gtest_ar.message_);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  local_348[1] = 3;
  local_348[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::connect>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_349);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_340,"event_process_result::process",
             "fsm.process_event(events::connect{})",local_348 + 1,local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ae,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_358);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  local_371 = detail::
              state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::connection_fsm_def::connecting>
                        ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                          *)local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_370,&local_371,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_370);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_370,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::connecting>()","false","true"
               ,in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1af,pcVar6);
    testing::internal::AssertHelper::operator=(&local_388,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_370);
  local_3c0[1] = 3;
  local_3c0[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::complete>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_3c1);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_3b8,"event_process_result::process",
             "fsm.process_event(events::complete{})",local_3c0 + 1,local_3c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1b0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  bVar1 = detail::
          state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          ::is_in_state<afsm::test::connection_fsm_def::connecting>
                    ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                      *)local_2c0);
  local_3e9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3e8,&local_3e9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_3e8,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::connecting>()","true","false"
               ,in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_400,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1b1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_400);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_3f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  local_431 = detail::
              state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::connection_fsm_def::authorizing>
                        ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                          *)local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_430,&local_431,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_430,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::authorizing>()","false",
               "true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1b2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  bVar1 = detail::
          state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          ::is_in_state<afsm::test::connection_fsm_def::idle>
                    ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                      *)local_2c0);
  local_479 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_478,&local_479,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_478,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::idle>()","true","false",in_R9
              );
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1b3,pcVar6);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  local_4c8[1] = 3;
  local_4c8[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_4c9);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_4c0,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_4c8 + 1,local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1b4,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_4d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_4f1 = detail::
              state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::connection_fsm_def::idle>
                        ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                          *)local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_4f0,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::idle>()","false","true",in_R9
              );
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1b5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_508,&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  anon_unknown_7::begin_transaction((connection_fsm *)local_2c0);
  local_540[1] = 3;
  local_540[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::execute>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_541);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_538,"event_process_result::process",
             "fsm.process_event(events::execute{})",local_540 + 1,local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ba,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__5.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
  local_569 = detail::
              state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::connection_fsm_def::transaction::simple_query>
                        ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                          *)local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_568,&local_569,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_568,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::transaction::simple_query>()"
               ,"false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1bb,pcVar6);
    testing::internal::AssertHelper::operator=(&local_580,&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_578);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  local_5b1 = detail::
              state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::connection_fsm_def::transaction::simple_query::waiting>
                        ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                          *)local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5b0,&local_5b1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_5b0,
               (AssertionResult *)
               "fsm.is_in_state<connection_fsm_def::transaction::simple_query::waiting>()","false",
               "true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1bc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  local_600[1] = 3;
  local_600[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::row_description>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_601);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_5f8,"event_process_result::process",
             "fsm.process_event(events::row_description{})",local_600 + 1,local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_610);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1bd,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_610);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_610);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  local_629 = detail::
              state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::connection_fsm_def::transaction::simple_query>
                        ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                          *)local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_628,&local_629,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_628,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::transaction::simple_query>()"
               ,"false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1be,pcVar6);
    testing::internal::AssertHelper::operator=(&local_640,&local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  local_671 = detail::
              state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
              ::is_in_state<afsm::test::connection_fsm_def::transaction::simple_query::fetch_data>
                        ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                          *)local_2c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_670,&local_671,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(&local_680);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_670,
               (AssertionResult *)
               "fsm.is_in_state<connection_fsm_def::transaction::simple_query::fetch_data>()",
               "false","true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_688,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1bf,pcVar6);
    testing::internal::AssertHelper::operator=(&local_688,&local_680);
    testing::internal::AssertHelper::~AssertHelper(&local_688);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_6c0[1] = 2;
  local_6c0[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::row_event>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_6c1);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_6b8,"event_process_result::process_in_state",
             "fsm.process_event(events::row_event{})",local_6c0 + 1,local_6c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1c0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_6d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_6d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  local_6f0[1] = 2;
  local_6f0[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::row_event>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_6f1);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_6e8,"event_process_result::process_in_state",
             "fsm.process_event(events::row_event{})",local_6f0 + 1,local_6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
  if (!bVar1) {
    testing::Message::Message(&local_700);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_6e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1c1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
  local_720[1] = 3;
  local_720[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::command_complete>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_721);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_718,"event_process_result::process",
             "fsm.process_event(events::command_complete{})",local_720 + 1,local_720);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1c2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  local_750[1] = 3;
  local_750[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_751);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_748,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_750 + 1,local_750);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_760);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1c3,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  anon_unknown_7::commit_transaction((connection_fsm *)local_2c0);
  anon_unknown_7::begin_transaction((connection_fsm *)local_2c0);
  local_780[1] = 3;
  local_780[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::exec_prepared>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_781);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_778,"event_process_result::process",
             "fsm.process_event(events::exec_prepared{})",local_780 + 1,local_780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_790);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ca,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_790);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_790);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  local_7b0[1] = 2;
  local_7b0[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::no_data>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_7b1);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_7a8,"event_process_result::process_in_state",
             "fsm.process_event(events::no_data{})",local_7b0 + 1,local_7b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7c0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1cc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7a8);
  local_7e0[1] = 3;
  local_7e0[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_7e1);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_7d8,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_7e0 + 1,local_7e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_7f0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1ce,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  local_810[1] = 3;
  local_810[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_811);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_808,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_810 + 1,local_810);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1d0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_820);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_820);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  local_840[1] = 3;
  local_840[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::ready_for_query>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_841);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_838,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_840 + 1,local_840);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_838);
  if (!bVar1) {
    testing::Message::Message(&local_850);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_838);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1d2,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_838);
  anon_unknown_7::commit_transaction((connection_fsm *)local_2c0);
  local_870[1] = 3;
  local_870[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                 ::process_event<afsm::test::events::terminate>
                           ((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                             *)local_2c0,&local_871);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_868,"event_process_result::process",
             "fsm.process_event(events::terminate{})",local_870 + 1,local_870);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
  if (!bVar1) {
    testing::Message::Message(&local_880);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
    testing::internal::AssertHelper::AssertHelper
              (&local_888,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x1d7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_888,&local_880);
    testing::internal::AssertHelper::~AssertHelper(&local_888);
    testing::Message::~Message(&local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  ::~state_machine((state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                    *)local_2c0);
  return;
}

Assistant:

TEST(TranFSM, AllEvents)
{
    using actions::event_process_result;
    using ::psst::ansi_color;
    connection_fsm fsm;
    fsm.make_observer("connection_fsm_def");

    ::std::cerr << fsm.get_state< connection_fsm_def >().name() << "\n";
    ::std::cerr << fsm.get_state< connection_fsm::transaction >().name() << "\n";
    ::std::cerr << fsm.get_state< connection_fsm::transaction::simple_query >().name() << "\n";

    EXPECT_EQ(event_process_result::process, fsm.process_event(events::connect{}));
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::connecting>());
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::complete{}));
    EXPECT_FALSE(fsm.is_in_state<connection_fsm_def::connecting>());
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::authorizing>());
    EXPECT_FALSE(fsm.is_in_state<connection_fsm_def::idle>());
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::idle>());

    begin_transaction(fsm);

    // Simple query sequence
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::execute{}));
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::simple_query>());
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::simple_query::waiting>());
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::row_description{}));
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::simple_query>());
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::simple_query::fetch_data>());
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::row_event{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::command_complete{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    commit_transaction(fsm);

    begin_transaction(fsm);

    // Extended query no data sequence
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::exec_prepared{}));
    // parse -> parse
    EXPECT_EQ(event_process_result::process_in_state, fsm.process_event(events::no_data{}));
    // parse -> bind
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // bind -> exec
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));
    // exec -> idle
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    commit_transaction(fsm);

    // Terminate connection
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::terminate{}));
}